

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

void __thiscall astar::details::LogStream::~LogStream(LogStream *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)this);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~LogStream() { std::cerr << data << std::endl; }